

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int generate_by_miniscript_after
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  int iVar2;
  size_t child_write_len;
  
  child_write_len = *write_len;
  iVar1 = -2;
  iVar2 = iVar1;
  if (((0x13 < script_len && node->child != (miniscript_node_t *)0x0) &&
      (((parent == (miniscript_node_t *)0x0 || (parent->info != (miniscript_item_t *)0x0)) &&
       (iVar2 = generate_script_from_miniscript
                          (node->child,node,derive_child_num,script,script_len,&child_write_len),
       iVar2 == 0)))) && (iVar2 = iVar1, 0xfffffffffffffdf6 < child_write_len - 0x208)) {
    script[child_write_len] = 0xb1;
    *write_len = child_write_len + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int generate_by_miniscript_after(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    if (!node->child || (script_len < DESCRIPTOR_MIN_SIZE) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(
        node->child, node, derive_child_num, script, script_len, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len + 1 > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    script[child_write_len] = OP_CHECKLOCKTIMEVERIFY;
    *write_len = child_write_len + 1;
    return ret;
}